

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_suite.cpp
# Opt level: O0

void vector_suite::test_empty(void)

{
  vector<char,_std::allocator<char>_> **ppvVar1;
  iterator iVar2;
  iterator iVar3;
  iterator pvVar4;
  iterator pvVar5;
  array<char,_0UL> local_3d [8];
  array<char,_0UL> expected;
  undefined1 local_30 [8];
  vector_buffer<char,_trial::protocol::buffer::vector<char,_std::allocator<char>_>_> container;
  vector<char,_std::allocator<char>_> output;
  
  ppvVar1 = &container.super_vector<char,_std::allocator<char>_>.buffer;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)ppvVar1);
  vector_buffer<char,_trial::protocol::buffer::vector<char,_std::allocator<char>_>_>::vector_buffer
            ((vector_buffer<char,_trial::protocol::buffer::vector<char,_std::allocator<char>_>_> *)
             local_30,(vector<char,_std::allocator<char>_> *)ppvVar1);
  ppvVar1 = &container.super_vector<char,_std::allocator<char>_>.buffer;
  iVar2 = std::vector<char,_std::allocator<char>_>::begin
                    ((vector<char,_std::allocator<char>_> *)ppvVar1);
  iVar3 = std::vector<char,_std::allocator<char>_>::end
                    ((vector<char,_std::allocator<char>_> *)ppvVar1);
  pvVar4 = std::array<char,_0UL>::begin(local_3d);
  pvVar5 = std::array<char,_0UL>::end(local_3d);
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,char*,std::equal_to<char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/vector_suite.cpp"
             ,0x40,"void vector_suite::test_empty()",iVar2._M_current,iVar3._M_current,pvVar4,pvVar5
            );
  vector_buffer<char,_trial::protocol::buffer::vector<char,_std::allocator<char>_>_>::~vector_buffer
            ((vector_buffer<char,_trial::protocol::buffer::vector<char,_std::allocator<char>_>_> *)
             local_30);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)
             &container.super_vector<char,_std::allocator<char>_>.buffer);
  return;
}

Assistant:

void test_empty()
{
    std::vector<char> output;
    vector_buffer<char> container(output);

    std::array<char, 0> expected;
    TRIAL_PROTOCOL_TEST_ALL_WITH(output.begin(), output.end(),
                                 expected.begin(), expected.end(),
                                 std::equal_to<char>());
}